

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

int walkerParseTest(char *filename,char *result,char *err,int options)

{
  long lVar1;
  xmlTextReaderPtr reader_00;
  int ret;
  xmlTextReaderPtr reader;
  xmlDocPtr doc;
  int options_local;
  char *err_local;
  char *result_local;
  char *filename_local;
  
  lVar1 = xmlReadFile(filename,0,options | 0x40);
  if (lVar1 == 0) {
    fprintf(_stderr,"Failed to parse %s\n",filename);
    filename_local._4_4_ = -1;
  }
  else {
    reader_00 = (xmlTextReaderPtr)xmlReaderWalker(lVar1);
    filename_local._4_4_ = streamProcessTest(filename,result,err,reader_00,(char *)0x0,options);
    xmlFreeTextReader(reader_00);
    xmlFreeDoc(lVar1);
  }
  return filename_local._4_4_;
}

Assistant:

static int
walkerParseTest(const char *filename, const char *result, const char *err,
                int options) {
    xmlDocPtr doc;
    xmlTextReaderPtr reader;
    int ret;

    doc = xmlReadFile(filename, NULL, options | XML_PARSE_NOWARNING);
    if (doc == NULL) {
        fprintf(stderr, "Failed to parse %s\n", filename);
	return(-1);
    }
    reader = xmlReaderWalker(doc);
    ret = streamProcessTest(filename, result, err, reader, NULL, options);
    xmlFreeTextReader(reader);
    xmlFreeDoc(doc);
    return(ret);
}